

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

string * __thiscall
Json::Reader::getFormattedErrorMessages_abi_cxx11_(string *__return_storage_ptr__,Reader *this)

{
  _Elt_pointer pEVar1;
  _Map_pointer local_a0;
  _Elt_pointer local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pEVar1 = (this->errors_).
           super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  local_98 = (this->errors_).
             super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last;
  local_a0 = (this->errors_).
             super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node;
  while (pEVar1 != (this->errors_).
                   super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    getLocationLineAndColumn_abi_cxx11_(&local_50,this,(pEVar1->token_).start_);
    std::operator+(&local_90,"* ",&local_50);
    std::operator+(&local_70,&local_90,"\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::operator+(&local_90,"  ",&pEVar1->message_);
    std::operator+(&local_70,&local_90,"\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    if (pEVar1->extra_ != (Location)0x0) {
      getLocationLineAndColumn_abi_cxx11_(&local_50,this,pEVar1->extra_);
      std::operator+(&local_90,"See ",&local_50);
      std::operator+(&local_70,&local_90," for detail.\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    pEVar1 = pEVar1 + 1;
    if (pEVar1 == local_98) {
      pEVar1 = local_a0[1];
      local_a0 = local_a0 + 1;
      local_98 = pEVar1 + 8;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

JSONCPP_STRING Reader::getFormattedErrorMessages() const {
  JSONCPP_STRING formattedMessage;
  for (Errors::const_iterator itError = errors_.begin();
       itError != errors_.end();
       ++itError) {
    const ErrorInfo& error = *itError;
    formattedMessage +=
        "* " + getLocationLineAndColumn(error.token_.start_) + "\n";
    formattedMessage += "  " + error.message_ + "\n";
    if (error.extra_)
      formattedMessage +=
          "See " + getLocationLineAndColumn(error.extra_) + " for detail.\n";
  }
  return formattedMessage;
}